

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_FragmentedCordInput_Test::TestBody
          (IoTest_FragmentedCordInput_Test *this)

{
  int iVar1;
  bool bVar2;
  unsigned_long *puVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined1 local_180 [8];
  CordInputStream input;
  Cord fragmented_cord;
  unsigned_long local_98;
  size_type local_90;
  size_type local_88;
  size_t n;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  fragments;
  string_view str_piece;
  int local_50;
  int block_size;
  int i;
  undefined1 local_40 [8];
  StringOutputStream output;
  string str;
  IoTest_FragmentedCordInput_Test *this_local;
  
  std::__cxx11::string::string((string *)&output.target_);
  StringOutputStream::StringOutputStream((StringOutputStream *)local_40,(string *)&output.target_);
  IoTest::WriteStuff(&this->super_IoTest,(ZeroCopyOutputStream *)local_40);
  StringOutputStream::~StringOutputStream((StringOutputStream *)local_40);
  for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
    iVar1 = *(int *)(io::(anonymous_namespace)::IoTest::kBlockSizes + (long)local_50 * 4);
    if (-1 < iVar1) {
      fragments.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&output.target_);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&n);
      while (bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &fragments.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        local_90 = std::basic_string_view<char,_std::char_traits<char>_>::size
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &fragments.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_98 = (unsigned_long)iVar1;
        puVar3 = std::min<unsigned_long>(&local_90,&local_98);
        local_88 = *puVar3;
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &fragments.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0,local_88);
        fragmented_cord.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)bVar4._M_len;
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&n,(value_type *)((long)&fragmented_cord.contents_.data_.rep_.field_0 + 8));
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   &fragments.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_88);
      }
      io::(anonymous_namespace)::
      MakeFragmentedCord<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                ((_anonymous_namespace_ *)&input.available_,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&n);
      CordInputStream::CordInputStream((CordInputStream *)local_180,(Cord *)&input.available_);
      IoTest::ReadStuff(&this->super_IoTest,(ZeroCopyInputStream *)local_180,true);
      CordInputStream::~CordInputStream((CordInputStream *)local_180);
      absl::lts_20250127::Cord::~Cord((Cord *)&input.available_);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&n);
    }
  }
  std::__cxx11::string::~string((string *)&output.target_);
  return;
}

Assistant:

TEST_F(IoTest, FragmentedCordInput) {
  std::string str;
  {
    StringOutputStream output(&str);
    WriteStuff(&output);
  }

  for (int i = 0; i < kBlockSizeCount; i++) {
    int block_size = kBlockSizes[i];
    if (block_size < 0) {
      // Skip the -1 case.
      continue;
    }
    absl::string_view str_piece = str;

    // Create a fragmented cord by splitting the input into many cord
    // functions.
    std::vector<absl::string_view> fragments;
    while (!str_piece.empty()) {
      size_t n = std::min<size_t>(str_piece.size(), block_size);
      fragments.push_back(str_piece.substr(0, n));
      str_piece.remove_prefix(n);
    }
    absl::Cord fragmented_cord = MakeFragmentedCord(fragments);

    CordInputStream input(&fragmented_cord);
    ReadStuff(&input);
  }
}